

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::AddDescriptorsImpl(void)

{
  _func_void *in_stack_00000008;
  
  InitDefaults();
  DescriptorPool::InternalAddGeneratedFile(AddDescriptorsImpl::descriptor,0x15d7);
  MessageFactory::InternalRegisterGeneratedFile
            ("google/protobuf/descriptor.proto",anon_unknown_5::protobuf_RegisterTypes);
  internal::OnShutdown(in_stack_00000008);
  return;
}

Assistant:

void AddDescriptorsImpl() {
  InitDefaults();
  static const char descriptor[] = {
      "\n google/protobuf/descriptor.proto\022\017goog"
      "le.protobuf\"G\n\021FileDescriptorSet\0222\n\004file"
      "\030\001 \003(\0132$.google.protobuf.FileDescriptorP"
      "roto\"\333\003\n\023FileDescriptorProto\022\014\n\004name\030\001 \001"
      "(\t\022\017\n\007package\030\002 \001(\t\022\022\n\ndependency\030\003 \003(\t\022"
      "\031\n\021public_dependency\030\n \003(\005\022\027\n\017weak_depen"
      "dency\030\013 \003(\005\0226\n\014message_type\030\004 \003(\0132 .goog"
      "le.protobuf.DescriptorProto\0227\n\tenum_type"
      "\030\005 \003(\0132$.google.protobuf.EnumDescriptorP"
      "roto\0228\n\007service\030\006 \003(\0132\'.google.protobuf."
      "ServiceDescriptorProto\0228\n\textension\030\007 \003("
      "\0132%.google.protobuf.FieldDescriptorProto"
      "\022-\n\007options\030\010 \001(\0132\034.google.protobuf.File"
      "Options\0229\n\020source_code_info\030\t \001(\0132\037.goog"
      "le.protobuf.SourceCodeInfo\022\016\n\006syntax\030\014 \001"
      "(\t\"\360\004\n\017DescriptorProto\022\014\n\004name\030\001 \001(\t\0224\n\005"
      "field\030\002 \003(\0132%.google.protobuf.FieldDescr"
      "iptorProto\0228\n\textension\030\006 \003(\0132%.google.p"
      "rotobuf.FieldDescriptorProto\0225\n\013nested_t"
      "ype\030\003 \003(\0132 .google.protobuf.DescriptorPr"
      "oto\0227\n\tenum_type\030\004 \003(\0132$.google.protobuf"
      ".EnumDescriptorProto\022H\n\017extension_range\030"
      "\005 \003(\0132/.google.protobuf.DescriptorProto."
      "ExtensionRange\0229\n\noneof_decl\030\010 \003(\0132%.goo"
      "gle.protobuf.OneofDescriptorProto\0220\n\007opt"
      "ions\030\007 \001(\0132\037.google.protobuf.MessageOpti"
      "ons\022F\n\016reserved_range\030\t \003(\0132..google.pro"
      "tobuf.DescriptorProto.ReservedRange\022\025\n\rr"
      "eserved_name\030\n \003(\t\032,\n\016ExtensionRange\022\r\n\005"
      "start\030\001 \001(\005\022\013\n\003end\030\002 \001(\005\032+\n\rReservedRang"
      "e\022\r\n\005start\030\001 \001(\005\022\013\n\003end\030\002 \001(\005\"\274\005\n\024FieldD"
      "escriptorProto\022\014\n\004name\030\001 \001(\t\022\016\n\006number\030\003"
      " \001(\005\022:\n\005label\030\004 \001(\0162+.google.protobuf.Fi"
      "eldDescriptorProto.Label\0228\n\004type\030\005 \001(\0162*"
      ".google.protobuf.FieldDescriptorProto.Ty"
      "pe\022\021\n\ttype_name\030\006 \001(\t\022\020\n\010extendee\030\002 \001(\t\022"
      "\025\n\rdefault_value\030\007 \001(\t\022\023\n\013oneof_index\030\t "
      "\001(\005\022\021\n\tjson_name\030\n \001(\t\022.\n\007options\030\010 \001(\0132"
      "\035.google.protobuf.FieldOptions\"\266\002\n\004Type\022"
      "\017\n\013TYPE_DOUBLE\020\001\022\016\n\nTYPE_FLOAT\020\002\022\016\n\nTYPE"
      "_INT64\020\003\022\017\n\013TYPE_UINT64\020\004\022\016\n\nTYPE_INT32\020"
      "\005\022\020\n\014TYPE_FIXED64\020\006\022\020\n\014TYPE_FIXED32\020\007\022\r\n"
      "\tTYPE_BOOL\020\010\022\017\n\013TYPE_STRING\020\t\022\016\n\nTYPE_GR"
      "OUP\020\n\022\020\n\014TYPE_MESSAGE\020\013\022\016\n\nTYPE_BYTES\020\014\022"
      "\017\n\013TYPE_UINT32\020\r\022\r\n\tTYPE_ENUM\020\016\022\021\n\rTYPE_"
      "SFIXED32\020\017\022\021\n\rTYPE_SFIXED64\020\020\022\017\n\013TYPE_SI"
      "NT32\020\021\022\017\n\013TYPE_SINT64\020\022\"C\n\005Label\022\022\n\016LABE"
      "L_OPTIONAL\020\001\022\022\n\016LABEL_REQUIRED\020\002\022\022\n\016LABE"
      "L_REPEATED\020\003\"T\n\024OneofDescriptorProto\022\014\n\004"
      "name\030\001 \001(\t\022.\n\007options\030\002 \001(\0132\035.google.pro"
      "tobuf.OneofOptions\"\214\001\n\023EnumDescriptorPro"
      "to\022\014\n\004name\030\001 \001(\t\0228\n\005value\030\002 \003(\0132).google"
      ".protobuf.EnumValueDescriptorProto\022-\n\007op"
      "tions\030\003 \001(\0132\034.google.protobuf.EnumOption"
      "s\"l\n\030EnumValueDescriptorProto\022\014\n\004name\030\001 "
      "\001(\t\022\016\n\006number\030\002 \001(\005\0222\n\007options\030\003 \001(\0132!.g"
      "oogle.protobuf.EnumValueOptions\"\220\001\n\026Serv"
      "iceDescriptorProto\022\014\n\004name\030\001 \001(\t\0226\n\006meth"
      "od\030\002 \003(\0132&.google.protobuf.MethodDescrip"
      "torProto\0220\n\007options\030\003 \001(\0132\037.google.proto"
      "buf.ServiceOptions\"\301\001\n\025MethodDescriptorP"
      "roto\022\014\n\004name\030\001 \001(\t\022\022\n\ninput_type\030\002 \001(\t\022\023"
      "\n\013output_type\030\003 \001(\t\022/\n\007options\030\004 \001(\0132\036.g"
      "oogle.protobuf.MethodOptions\022\037\n\020client_s"
      "treaming\030\005 \001(\010:\005false\022\037\n\020server_streamin"
      "g\030\006 \001(\010:\005false\"\264\005\n\013FileOptions\022\024\n\014java_p"
      "ackage\030\001 \001(\t\022\034\n\024java_outer_classname\030\010 \001"
      "(\t\022\"\n\023java_multiple_files\030\n \001(\010:\005false\022)"
      "\n\035java_generate_equals_and_hash\030\024 \001(\010B\002\030"
      "\001\022%\n\026java_string_check_utf8\030\033 \001(\010:\005false"
      "\022F\n\014optimize_for\030\t \001(\0162).google.protobuf"
      ".FileOptions.OptimizeMode:\005SPEED\022\022\n\ngo_p"
      "ackage\030\013 \001(\t\022\"\n\023cc_generic_services\030\020 \001("
      "\010:\005false\022$\n\025java_generic_services\030\021 \001(\010:"
      "\005false\022\"\n\023py_generic_services\030\022 \001(\010:\005fal"
      "se\022\031\n\ndeprecated\030\027 \001(\010:\005false\022\037\n\020cc_enab"
      "le_arenas\030\037 \001(\010:\005false\022\031\n\021objc_class_pre"
      "fix\030$ \001(\t\022\030\n\020csharp_namespace\030% \001(\t\022\024\n\014s"
      "wift_prefix\030\' \001(\t\022\030\n\020php_class_prefix\030( "
      "\001(\t\022C\n\024uninterpreted_option\030\347\007 \003(\0132$.goo"
      "gle.protobuf.UninterpretedOption\":\n\014Opti"
      "mizeMode\022\t\n\005SPEED\020\001\022\r\n\tCODE_SIZE\020\002\022\020\n\014LI"
      "TE_RUNTIME\020\003*\t\010\350\007\020\200\200\200\200\002J\004\010&\020\'\"\362\001\n\016Messag"
      "eOptions\022&\n\027message_set_wire_format\030\001 \001("
      "\010:\005false\022.\n\037no_standard_descriptor_acces"
      "sor\030\002 \001(\010:\005false\022\031\n\ndeprecated\030\003 \001(\010:\005fa"
      "lse\022\021\n\tmap_entry\030\007 \001(\010\022C\n\024uninterpreted_"
      "option\030\347\007 \003(\0132$.google.protobuf.Uninterp"
      "retedOption*\t\010\350\007\020\200\200\200\200\002J\004\010\010\020\tJ\004\010\t\020\n\"\236\003\n\014F"
      "ieldOptions\022:\n\005ctype\030\001 \001(\0162#.google.prot"
      "obuf.FieldOptions.CType:\006STRING\022\016\n\006packe"
      "d\030\002 \001(\010\022\?\n\006jstype\030\006 \001(\0162$.google.protobu"
      "f.FieldOptions.JSType:\tJS_NORMAL\022\023\n\004lazy"
      "\030\005 \001(\010:\005false\022\031\n\ndeprecated\030\003 \001(\010:\005false"
      "\022\023\n\004weak\030\n \001(\010:\005false\022C\n\024uninterpreted_o"
      "ption\030\347\007 \003(\0132$.google.protobuf.Uninterpr"
      "etedOption\"/\n\005CType\022\n\n\006STRING\020\000\022\010\n\004CORD\020"
      "\001\022\020\n\014STRING_PIECE\020\002\"5\n\006JSType\022\r\n\tJS_NORM"
      "AL\020\000\022\r\n\tJS_STRING\020\001\022\r\n\tJS_NUMBER\020\002*\t\010\350\007\020"
      "\200\200\200\200\002J\004\010\004\020\005\"^\n\014OneofOptions\022C\n\024uninterpr"
      "eted_option\030\347\007 \003(\0132$.google.protobuf.Uni"
      "nterpretedOption*\t\010\350\007\020\200\200\200\200\002\"\223\001\n\013EnumOpti"
      "ons\022\023\n\013allow_alias\030\002 \001(\010\022\031\n\ndeprecated\030\003"
      " \001(\010:\005false\022C\n\024uninterpreted_option\030\347\007 \003"
      "(\0132$.google.protobuf.UninterpretedOption"
      "*\t\010\350\007\020\200\200\200\200\002J\004\010\005\020\006\"}\n\020EnumValueOptions\022\031\n"
      "\ndeprecated\030\001 \001(\010:\005false\022C\n\024uninterprete"
      "d_option\030\347\007 \003(\0132$.google.protobuf.Uninte"
      "rpretedOption*\t\010\350\007\020\200\200\200\200\002\"{\n\016ServiceOptio"
      "ns\022\031\n\ndeprecated\030! \001(\010:\005false\022C\n\024uninter"
      "preted_option\030\347\007 \003(\0132$.google.protobuf.U"
      "ninterpretedOption*\t\010\350\007\020\200\200\200\200\002\"\255\002\n\rMethod"
      "Options\022\031\n\ndeprecated\030! \001(\010:\005false\022_\n\021id"
      "empotency_level\030\" \001(\0162/.google.protobuf."
      "MethodOptions.IdempotencyLevel:\023IDEMPOTE"
      "NCY_UNKNOWN\022C\n\024uninterpreted_option\030\347\007 \003"
      "(\0132$.google.protobuf.UninterpretedOption"
      "\"P\n\020IdempotencyLevel\022\027\n\023IDEMPOTENCY_UNKN"
      "OWN\020\000\022\023\n\017NO_SIDE_EFFECTS\020\001\022\016\n\nIDEMPOTENT"
      "\020\002*\t\010\350\007\020\200\200\200\200\002\"\236\002\n\023UninterpretedOption\022;\n"
      "\004name\030\002 \003(\0132-.google.protobuf.Uninterpre"
      "tedOption.NamePart\022\030\n\020identifier_value\030\003"
      " \001(\t\022\032\n\022positive_int_value\030\004 \001(\004\022\032\n\022nega"
      "tive_int_value\030\005 \001(\003\022\024\n\014double_value\030\006 \001"
      "(\001\022\024\n\014string_value\030\007 \001(\014\022\027\n\017aggregate_va"
      "lue\030\010 \001(\t\0323\n\010NamePart\022\021\n\tname_part\030\001 \002(\t"
      "\022\024\n\014is_extension\030\002 \002(\010\"\325\001\n\016SourceCodeInf"
      "o\022:\n\010location\030\001 \003(\0132(.google.protobuf.So"
      "urceCodeInfo.Location\032\206\001\n\010Location\022\020\n\004pa"
      "th\030\001 \003(\005B\002\020\001\022\020\n\004span\030\002 \003(\005B\002\020\001\022\030\n\020leadin"
      "g_comments\030\003 \001(\t\022\031\n\021trailing_comments\030\004 "
      "\001(\t\022!\n\031leading_detached_comments\030\006 \003(\t\"\247"
      "\001\n\021GeneratedCodeInfo\022A\n\nannotation\030\001 \003(\013"
      "2-.google.protobuf.GeneratedCodeInfo.Ann"
      "otation\032O\n\nAnnotation\022\020\n\004path\030\001 \003(\005B\002\020\001\022"
      "\023\n\013source_file\030\002 \001(\t\022\r\n\005begin\030\003 \001(\005\022\013\n\003e"
      "nd\030\004 \001(\005B\214\001\n\023com.google.protobufB\020Descri"
      "ptorProtosH\001Z>github.com/golang/protobuf"
      "/protoc-gen-go/descriptor;descriptor\242\002\003G"
      "PB\252\002\032Google.Protobuf.Reflection"
  };
  ::google::protobuf::DescriptorPool::InternalAddGeneratedFile(
      descriptor, 5591);
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(
    "google/protobuf/descriptor.proto", &protobuf_RegisterTypes);
  ::google::protobuf::internal::OnShutdown(&TableStruct::Shutdown);
}